

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlexer.cpp
# Opt level: O0

void __thiscall SQLexer::Next(SQLexer *this)

{
  SQLexer *this_00;
  SQChar *in_RDI;
  SQInteger t;
  
  this_00 = (SQLexer *)(**(code **)(in_RDI + 0x50))(*(undefined8 *)(in_RDI + 0x58));
  if (0xff < (long)this_00) {
    Error(this_00,in_RDI);
  }
  if (this_00 == (SQLexer *)0x0) {
    in_RDI[0x60] = '\0';
    in_RDI[0x10] = '\x01';
    in_RDI[0x11] = '\0';
    in_RDI[0x12] = '\0';
    in_RDI[0x13] = '\0';
    in_RDI[0x14] = '\0';
    in_RDI[0x15] = '\0';
    in_RDI[0x16] = '\0';
    in_RDI[0x17] = '\0';
  }
  else {
    in_RDI[0x60] = (SQChar)this_00;
  }
  return;
}

Assistant:

void SQLexer::Next()
{
    SQInteger t = _readf(_up);
    if(t > MAX_CHAR) Error(_SC("Invalid character"));
    if(t != 0) {
        _currdata = (LexChar)t;
        return;
    }
    _currdata = SQUIRREL_EOB;
    _reached_eof = SQTrue;
}